

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

CURLcode AddFormData(FormData **formp,formtype type,void *line,curl_off_t length,curl_off_t *size)

{
  byte *__file;
  uint uVar1;
  int iVar2;
  FormData *pFVar3;
  char *__dest;
  CURLcode CVar4;
  stat file;
  stat64 local_c0;
  
  if ((length < 0) || ((size != (curl_off_t *)0x0 && (*size < 0)))) {
LAB_0057cfbc:
    CVar4 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    pFVar3 = (FormData *)(*Curl_cmalloc)(0x20);
    if (pFVar3 == (FormData *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pFVar3->next = (FormData *)0x0;
    if (type < FORM_CALLBACK) {
      if (length == 0) {
        length = strlen((char *)line);
      }
      if (type == FORM_DATAMEM) {
        pFVar3->line = (char *)line;
        type = FORM_DATA;
        __dest = (char *)0x0;
      }
      else {
        __dest = (char *)(*Curl_cmalloc)(length + 1);
        pFVar3->line = __dest;
        if (__dest == (char *)0x0) {
          (*Curl_cfree)(pFVar3);
          return CURLE_OUT_OF_MEMORY;
        }
        memcpy(__dest,line,length);
        pFVar3->line[length] = '\0';
      }
      pFVar3->length = length;
    }
    else {
      pFVar3->line = (char *)line;
      __dest = (char *)0x0;
    }
    pFVar3->type = type;
    if (size != (curl_off_t *)0x0) {
      if (type == FORM_FILE) {
        __file = (byte *)pFVar3->line;
        uVar1 = *__file - 0x2d;
        if (uVar1 == 0) {
          uVar1 = (uint)__file[1];
        }
        if (uVar1 != 0) {
          iVar2 = stat64((char *)__file,&local_c0);
          if ((iVar2 != 0) || ((local_c0.st_mode & 0xf000) == 0x4000)) {
            (*Curl_cfree)(pFVar3);
            if (__dest != (char *)0x0) {
              (*Curl_cfree)(__dest);
            }
            goto LAB_0057cfbc;
          }
          *size = *size + local_c0.st_size;
        }
      }
      else {
        *size = *size + length;
      }
    }
    if (*formp != (FormData *)0x0) {
      (*formp)->next = pFVar3;
    }
    *formp = pFVar3;
    CVar4 = CURLE_OK;
  }
  return CVar4;
}

Assistant:

static CURLcode AddFormData(struct FormData **formp,
                            enum formtype type,
                            const void *line,
                            curl_off_t length,
                            curl_off_t *size)
{
  struct FormData *newform;
  char *alloc2 = NULL;
  CURLcode result = CURLE_OK;
  if(length < 0 || (size && *size < 0))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  newform = malloc(sizeof(struct FormData));
  if(!newform)
    return CURLE_OUT_OF_MEMORY;
  newform->next = NULL;

  if(type <= FORM_CONTENT) {
    /* we make it easier for plain strings: */
    if(!length)
      length = strlen((char *)line);
#if (SIZEOF_SIZE_T < CURL_SIZEOF_CURL_OFF_T)
    else if(length >= (curl_off_t)(size_t)-1) {
      result = CURLE_BAD_FUNCTION_ARGUMENT;
      goto error;
    }
#endif
    if(type != FORM_DATAMEM) {
      newform->line = malloc((size_t)length+1);
      if(!newform->line) {
        result = CURLE_OUT_OF_MEMORY;
        goto error;
      }
      alloc2 = newform->line;
      memcpy(newform->line, line, (size_t)length);

      /* zero terminate for easier debugging */
      newform->line[(size_t)length]=0;
    }
    else {
      newform->line = (char *)line;
      type = FORM_DATA; /* in all other aspects this is just FORM_DATA */
    }
    newform->length = (size_t)length;
  }
  else
    /* For callbacks and files we don't have any actual data so we just keep a
       pointer to whatever this points to */
    newform->line = (char *)line;

  newform->type = type;

  if(size) {
    if(type != FORM_FILE)
      /* for static content as well as callback data we add the size given
         as input argument */
      *size += length;
    else {
      /* Since this is a file to be uploaded here, add the size of the actual
         file */
      if(strcmp("-", newform->line)) {
        struct_stat file;
        if(!stat(newform->line, &file) && !S_ISDIR(file.st_mode))
          *size += filesize(newform->line, file);
        else {
          result = CURLE_BAD_FUNCTION_ARGUMENT;
          goto error;
        }
      }
    }
  }

  if(*formp) {
    (*formp)->next = newform;
    *formp = newform;
  }
  else
    *formp = newform;

  return CURLE_OK;
  error:
  if(newform)
    free(newform);
  if(alloc2)
    free(alloc2);
  return result;
}